

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O3

bool __thiscall
ODDLParser::OpenDDLExport::writeProperties(OpenDDLExport *this,DDLNode *node,string *statement)

{
  bool bVar1;
  Property *pPVar2;
  string *this_00;
  allocator<char> local_59;
  DDLNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (node != (DDLNode *)0x0) {
    pPVar2 = DDLNode::getProperties(node);
    if (pPVar2 != (Property *)0x0) {
      local_58 = node;
      std::__cxx11::string::append((char *)statement);
      bVar1 = true;
      do {
        if (!bVar1) {
          std::__cxx11::string::append((char *)statement);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,pPVar2->m_key->m_buffer,&local_59);
        std::__cxx11::string::_M_append((char *)statement,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        this_00 = statement;
        std::__cxx11::string::append((char *)statement);
        writeValue((OpenDDLExport *)this_00,pPVar2->m_value,statement);
        pPVar2 = pPVar2->m_next;
        bVar1 = false;
      } while (pPVar2 != (Property *)0x0);
      std::__cxx11::string::append((char *)statement);
      node = local_58;
    }
  }
  return node != (DDLNode *)0x0;
}

Assistant:

bool OpenDDLExport::writeProperties( DDLNode *node, std::string &statement ) {
    if ( ddl_nullptr == node ) {
        return false;
    }

    Property *prop( node->getProperties() );
    // if no properties are there, return
    if ( ddl_nullptr == prop ) {
        return true;
    }

    if ( ddl_nullptr != prop ) {
        // for instance (attrib = "position", bla=2)
        statement += "(";
        bool first( true );
        while ( ddl_nullptr != prop ) {
            if (!first) {
                statement += ", ";
            } else {
                first = false;
            }
            statement += std::string( prop->m_key->m_buffer );
            statement += " = ";
            writeValue( prop->m_value, statement );
            prop = prop->m_next;
        }

        statement += ")";
    }

    return true;
}